

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O1

void __thiscall Rml::DecoratorTiled::Tile::CalculateDimensions(Tile *this,Texture texture)

{
  Vector2f VVar1;
  Vector2i VVar2;
  Vector2f VVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Texture local_48;
  float local_38;
  float local_28;
  undefined1 local_18 [16];
  
  local_48._8_8_ = texture._8_8_;
  local_48.render_manager = texture.render_manager;
  if (this->tile_data_calculated == false) {
    this->tile_data_calculated = true;
    (this->tile_data).size.x = 0.0;
    (this->tile_data).size.y = 0.0;
    (this->tile_data).texcoords[0].x = 0.0;
    (this->tile_data).texcoords[0].y = 0.0;
    (this->tile_data).texcoords[1].x = 0.0;
    (this->tile_data).texcoords[1].y = 0.0;
    VVar2 = Texture::GetDimensions(&local_48);
    if ((ulong)VVar2 >> 0x20 == 0 || VVar2.x == 0) {
      (this->tile_data).size.x = 0.0;
      (this->tile_data).size.y = 0.0;
      (this->tile_data).texcoords[0].x = 0.0;
      (this->tile_data).texcoords[0].y = 0.0;
      (this->tile_data).texcoords[1].x = 0.0;
      (this->tile_data).texcoords[1].y = 0.0;
    }
    else {
      local_28 = (float)VVar2.y;
      local_38 = (float)VVar2.x;
      fVar4 = (this->position).y;
      fVar5 = (this->position).x;
      VVar1 = this->size;
      VVar3.y = local_28;
      VVar3.x = local_38;
      if (fVar4 != 0.0) {
        VVar3 = VVar1;
      }
      if (NAN(fVar4)) {
        VVar3 = VVar1;
      }
      if (fVar5 != 0.0) {
        VVar3 = VVar1;
      }
      if (NAN(fVar5)) {
        VVar3 = VVar1;
      }
      if ((this->size).y != 0.0 || (this->size).x != 0.0) {
        VVar3 = VVar1;
      }
      (this->tile_data).size = VVar3;
      fVar4 = (this->tile_data).size.x;
      local_18 = ZEXT416((uint)(fVar4 / local_38));
      fVar6 = (this->tile_data).size.y / local_28;
      fVar4 = Math::Absolute(fVar4);
      fVar5 = Math::Absolute((this->tile_data).size.y);
      (this->tile_data).size.x = fVar4;
      (this->tile_data).size.y = fVar5;
      local_38 = (this->position).x / local_38;
      local_28 = (this->position).y / local_28;
      (this->tile_data).texcoords[0].x = local_38;
      (this->tile_data).texcoords[0].y = local_28;
      (this->tile_data).texcoords[1].x = (float)local_18._0_4_ + local_38;
      (this->tile_data).texcoords[1].y = local_28 + fVar6;
    }
  }
  return;
}

Assistant:

void DecoratorTiled::Tile::CalculateDimensions(Texture texture) const
{
	if (!tile_data_calculated)
	{
		tile_data_calculated = true;
		tile_data = {};

		const Vector2f texture_dimensions(texture.GetDimensions());
		if (texture_dimensions.x == 0 || texture_dimensions.y == 0)
		{
			tile_data.size = Vector2f(0, 0);
			tile_data.texcoords[0] = Vector2f(0, 0);
			tile_data.texcoords[1] = Vector2f(0, 0);
		}
		else
		{
			// Need to scale the coordinates to normalized units and 'size' to absolute size (pixels)
			if (size.x == 0 && size.y == 0 && position.x == 0 && position.y == 0)
				tile_data.size = texture_dimensions;
			else
				tile_data.size = size;

			const Vector2f size_relative = tile_data.size / texture_dimensions;

			tile_data.size = Vector2f(Math::Absolute(tile_data.size.x), Math::Absolute(tile_data.size.y));

			tile_data.texcoords[0] = position / texture_dimensions;
			tile_data.texcoords[1] = size_relative + tile_data.texcoords[0];
		}
	}
}